

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O0

OPJ_OFF_T opj_stream_write_skip
                    (opj_stream_private_t *p_stream,OPJ_OFF_T p_size,opj_event_mgr_t *p_event_mgr)

{
  OPJ_BOOL OVar1;
  OPJ_OFF_T OVar2;
  opj_stream_private_t *local_48;
  opj_stream_private_t *local_40;
  OPJ_OFF_T l_skip_nb_bytes;
  OPJ_OFF_T l_current_skip_nb_bytes;
  OPJ_BOOL l_is_written;
  opj_event_mgr_t *p_event_mgr_local;
  OPJ_OFF_T p_size_local;
  opj_stream_private_t *p_stream_local;
  
  local_40 = (opj_stream_private_t *)0x0;
  if ((p_stream->m_status & 8) == 0) {
    OVar1 = opj_stream_flush(p_stream,p_event_mgr);
    p_event_mgr_local = (opj_event_mgr_t *)p_size;
    if (OVar1 == 0) {
      p_stream->m_status = p_stream->m_status | 8;
      p_stream->m_bytes_in_buffer = 0;
      p_stream_local = (opj_stream_private_t *)0xffffffffffffffff;
    }
    else {
      for (; 0 < (long)p_event_mgr_local;
          p_event_mgr_local = (opj_event_mgr_t *)((long)p_event_mgr_local - OVar2)) {
        OVar2 = (*p_stream->m_skip_fn)((OPJ_OFF_T)p_event_mgr_local,p_stream->m_user_data);
        if (OVar2 == -1) {
          opj_event_msg(p_event_mgr,4,"Stream error!\n");
          p_stream->m_status = p_stream->m_status | 8;
          p_stream->m_byte_offset = (long)&local_40->m_user_data + p_stream->m_byte_offset;
          if (local_40 == (opj_stream_private_t *)0x0) {
            local_48 = (opj_stream_private_t *)0xffffffffffffffff;
          }
          else {
            local_48 = local_40;
          }
          return (OPJ_OFF_T)local_48;
        }
        local_40 = (opj_stream_private_t *)((long)&local_40->m_user_data + OVar2);
      }
      p_stream->m_byte_offset = (long)&local_40->m_user_data + p_stream->m_byte_offset;
      p_stream_local = local_40;
    }
  }
  else {
    p_stream_local = (opj_stream_private_t *)0xffffffffffffffff;
  }
  return (OPJ_OFF_T)p_stream_local;
}

Assistant:

OPJ_OFF_T opj_stream_write_skip(opj_stream_private_t * p_stream,
                                OPJ_OFF_T p_size, opj_event_mgr_t * p_event_mgr)
{
    OPJ_BOOL l_is_written = 0;
    OPJ_OFF_T l_current_skip_nb_bytes = 0;
    OPJ_OFF_T l_skip_nb_bytes = 0;

    if (p_stream->m_status & OPJ_STREAM_STATUS_ERROR) {
        return (OPJ_OFF_T) - 1;
    }

    /* we should flush data */
    l_is_written = opj_stream_flush(p_stream, p_event_mgr);
    if (! l_is_written) {
        p_stream->m_status |= OPJ_STREAM_STATUS_ERROR;
        p_stream->m_bytes_in_buffer = 0;
        return (OPJ_OFF_T) - 1;
    }
    /* then skip */

    while (p_size > 0) {
        /* we should do an actual skip on the media */
        l_current_skip_nb_bytes = p_stream->m_skip_fn(p_size, p_stream->m_user_data);

        if (l_current_skip_nb_bytes == (OPJ_OFF_T) - 1) {
            opj_event_msg(p_event_mgr, EVT_INFO, "Stream error!\n");

            p_stream->m_status |= OPJ_STREAM_STATUS_ERROR;
            p_stream->m_byte_offset += l_skip_nb_bytes;
            /* end if stream */
            return l_skip_nb_bytes ? l_skip_nb_bytes : (OPJ_OFF_T) - 1;
        }
        p_size -= l_current_skip_nb_bytes;
        l_skip_nb_bytes += l_current_skip_nb_bytes;
    }

    p_stream->m_byte_offset += l_skip_nb_bytes;

    return l_skip_nb_bytes;
}